

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O0

void __thiscall QPrintDialogPrivate::_q_collapseOrExpandDialog(QPrintDialogPrivate *this)

{
  long lVar1;
  QWidget *pQVar2;
  QPushButton *pQVar3;
  bool bVar4;
  int iVar5;
  QPrintDialog *pQVar6;
  QPrintDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *widgetToHide;
  QPrintDialog *q;
  int collapseHeight;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = q_func(in_RDI);
  pQVar2 = in_RDI->bottom;
  bVar4 = QWidget::isVisible((QWidget *)0x16f11b);
  if (bVar4) {
    pQVar3 = in_RDI->collapseButton;
    QPrintDialog::tr(in_stack_ffffffffffffff68,
                     (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff5c);
    QAbstractButton::setText((QString *)pQVar3);
    QString::~QString((QString *)0x16f171);
    QWidget::y();
    QWidget::height((QWidget *)0x16f189);
    QWidget::y();
    QWidget::height((QWidget *)0x16f1bd);
  }
  else {
    pQVar3 = in_RDI->collapseButton;
    QPrintDialog::tr(in_stack_ffffffffffffff68,
                     (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff5c);
    QAbstractButton::setText((QString *)pQVar3);
    QString::~QString((QString *)0x16f215);
  }
  bVar4 = QWidget::isVisible((QWidget *)0x16f229);
  (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,(bVar4 ^ 0xffU) & 1);
  bVar4 = QWidget::isVisible((QWidget *)0x16f24c);
  if (!bVar4) {
    QWidget::layout();
    QLayout::activate();
    iVar5 = QWidget::width((QWidget *)0x16f276);
    QWidget::height((QWidget *)0x16f284);
    QSize::QSize((QSize *)CONCAT44(iVar5,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c,
                 in_stack_ffffffffffffff58);
    QWidget::resize((QSize *)pQVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintDialogPrivate::_q_collapseOrExpandDialog()
{
    int collapseHeight = 0;
    Q_Q(QPrintDialog);
    QWidget *widgetToHide = bottom;
    if (widgetToHide->isVisible()) {
        collapseButton->setText(QPrintDialog::tr("&Options >>"));
        collapseHeight = widgetToHide->y() + widgetToHide->height() - (top->y() + top->height());
    }
    else
        collapseButton->setText(QPrintDialog::tr("&Options <<"));
    widgetToHide->setVisible(! widgetToHide->isVisible());
    if (! widgetToHide->isVisible()) { // make it shrink
        q->layout()->activate();
        q->resize( QSize(q->width(), q->height() - collapseHeight) );
    }
}